

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

_Bool run_PPU_cycle(void)

{
  _Bool _Var1;
  ppu_regs local_12;
  line_status lStack_10;
  ppu_regs ppu_regs;
  line_status status;
  
  lStack_10 = get_ppu_line_status(scanline,dot);
  local_12 = get_ppu_registers();
  _Var1 = is_rendering_enabled(local_12);
  if (_Var1) {
    execute_ppu(&local_12,&stack0xfffffffffffffff0,scanline,dot);
  }
  tick(local_12,lStack_10,&scanline,&dot);
  _Var1 = check_VBlank(local_12,scanline,dot,&NMI_flag);
  return _Var1;
}

Assistant:

bool run_PPU_cycle() {
    line_status status = get_ppu_line_status(scanline, dot);
    ppu_regs ppu_regs = get_ppu_registers();

    if(is_rendering_enabled(ppu_regs))
        execute_ppu(&ppu_regs, &status, scanline, dot);

    tick(ppu_regs, status, &scanline, &dot);
    return check_VBlank(ppu_regs, scanline, dot, &NMI_flag);
}